

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

IPV4 * __thiscall
Network::Address::IPV4::getBroadcastAddress(IPV4 *__return_storage_ptr__,IPV4 *this)

{
  bool bVar1;
  int iVar2;
  SpecialAddress SVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined1 local_90 [4];
  uint32 addr;
  String mac;
  undefined1 local_78 [4];
  Type type;
  IPV4 gw;
  undefined1 local_50 [8];
  IPV4 mask;
  IPV4 local;
  int j;
  int i;
  IPV4 *this_local;
  
  iVar2 = getLocalInterfacesCount();
  local.address.sin_zero[0] = '\0';
  local.address.sin_zero[1] = '\0';
  local.address.sin_zero[2] = '\0';
  local.address.sin_zero[3] = '\0';
  while( true ) {
    if (iVar2 <= (int)local.address.sin_zero._0_4_) {
      IPV4(__return_storage_ptr__,0xff,0xff,0xff,0xff,0);
      return __return_storage_ptr__;
    }
    IPV4((IPV4 *)mask.address.sin_zero,0xff,0xff,0xff,0xff,0);
    IPV4((IPV4 *)local_50,0xff,0xff,0xff,0xff,0);
    IPV4((IPV4 *)local_78,0xff,0xff,0xff,0xff,0);
    Bstrlib::String::String((String *)local_90);
    bVar1 = getLocalInterfaceDetails
                      (local.address.sin_zero._0_4_,(IPV4 *)mask.address.sin_zero,(IPV4 *)local_50,
                       (IPV4 *)local_78,(Type *)((long)&mac.super_tagbstring.data + 4),
                       (String *)local_90,(String *)0x0);
    if (((bVar1) &&
        (local.super_BaseAddress._vptr_BaseAddress._4_4_ == (this->address).sin_addr.s_addr)) &&
       (SVar3 = getSpecialAddressType((IPV4 *)mask.address.sin_zero), (SVar3 & UsableMask) != Zero))
    {
      uVar4 = ntohl(local.super_BaseAddress._vptr_BaseAddress._4_4_);
      uVar5 = ntohl(mask.super_BaseAddress._vptr_BaseAddress._4_4_);
      uVar6 = ntohl(mask.super_BaseAddress._vptr_BaseAddress._4_4_);
      IPV4(__return_storage_ptr__,uVar4 & uVar5 | ~uVar6,0);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    Bstrlib::String::~String((String *)local_90);
    ~IPV4((IPV4 *)local_78);
    ~IPV4((IPV4 *)local_50);
    ~IPV4((IPV4 *)mask.address.sin_zero);
    if (bVar1) break;
    local.address.sin_zero._0_4_ = local.address.sin_zero._0_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

IPV4 IPV4::getBroadcastAddress() const
        {
            int i = getLocalInterfacesCount();
            for (int j = 0; j < i; j++)
            {
                IPV4 local, mask, gw;
                Type type;
                String mac;
                if (getLocalInterfaceDetails(j, local, mask, gw, type, mac))
                {
                    if (local.address.sin_addr.s_addr == address.sin_addr.s_addr && local.getSpecialAddressType() & UsableMask)
                    {
                        uint32 addr = (ntohl(local.address.sin_addr.s_addr) & ntohl(mask.address.sin_addr.s_addr)) | ~ ntohl(mask.address.sin_addr.s_addr);
                        return IPV4(addr);
                    }
                }
            }
            return IPV4();
        }